

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall
ADPlanner::DeleteSearchStateSpace(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  size_type sVar1;
  reference ppCVar2;
  long in_RSI;
  long *in_RDI;
  CHeap *unaff_retaddr;
  CMDPSTATE *state;
  int i;
  int iend;
  undefined8 in_stack_ffffffffffffffc8;
  int listindex;
  CList *this_00;
  CList *in_stack_ffffffffffffffd0;
  value_type in_stack_ffffffffffffffe0;
  int local_18;
  
  listindex = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (*(long *)(in_RSI + 0x10) != 0) {
    CHeap::makeemptyheap(*(CHeap **)(in_RSI + 0x10));
    in_stack_ffffffffffffffd0 = *(CList **)(in_RSI + 0x10);
    if (in_stack_ffffffffffffffd0 != (CList *)0x0) {
      CHeap::~CHeap(unaff_retaddr);
      operator_delete(in_stack_ffffffffffffffd0,0x18);
    }
    *(undefined8 *)(in_RSI + 0x10) = 0;
  }
  if (*(long *)(in_RSI + 0x18) != 0) {
    CList::makeemptylist(in_stack_ffffffffffffffd0,listindex);
    this_00 = *(CList **)(in_RSI + 0x18);
    if (this_00 != (CList *)0x0) {
      CList::~CList(this_00);
      operator_delete(this_00,0x18);
    }
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  sVar1 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                    ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RSI + 0x38));
  for (local_18 = 0; local_18 < (int)sVar1; local_18 = local_18 + 1) {
    ppCVar2 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RSI + 0x38),
                         (long)local_18);
    in_stack_ffffffffffffffe0 = *ppCVar2;
    (**(code **)(*in_RDI + 0xe8))(in_RDI,in_stack_ffffffffffffffe0->PlannerSpecificData);
    free(in_stack_ffffffffffffffe0->PlannerSpecificData);
    in_stack_ffffffffffffffe0->PlannerSpecificData = (void *)0x0;
  }
  CMDP::Delete((CMDP *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void ADPlanner::DeleteSearchStateSpace(ADSearchStateSpace_t* pSearchStateSpace)
{
    if (pSearchStateSpace->heap != NULL) {
        pSearchStateSpace->heap->makeemptyheap();
        delete pSearchStateSpace->heap;
        pSearchStateSpace->heap = NULL;
    }

    if (pSearchStateSpace->inconslist != NULL) {
        pSearchStateSpace->inconslist->makeemptylist(AD_INCONS_LIST_ID);
        delete pSearchStateSpace->inconslist;
        pSearchStateSpace->inconslist = NULL;
    }

    //delete the states themselves
    int iend = (int)pSearchStateSpace->searchMDP.StateArray.size();
    for (int i = 0; i < iend; i++) {
        CMDPSTATE* state = pSearchStateSpace->searchMDP.StateArray[i];
        DeleteSearchStateData((ADState*)state->PlannerSpecificData);
        free(state->PlannerSpecificData); // allocated with malloc() on line 199 of revision 19485
        state->PlannerSpecificData = NULL;
    }
    pSearchStateSpace->searchMDP.Delete();
}